

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O3

void floor0_free_look(vorbis_look_floor *i)

{
  vorbis_look_floor0 *look;
  undefined8 *__ptr;
  
  if (i != (vorbis_look_floor *)0x0) {
    __ptr = *(undefined8 **)((long)i + 8);
    if (__ptr != (undefined8 *)0x0) {
      if ((void *)*__ptr != (void *)0x0) {
        free((void *)*__ptr);
        __ptr = *(undefined8 **)((long)i + 8);
      }
      if ((void *)__ptr[1] != (void *)0x0) {
        free((void *)__ptr[1]);
        __ptr = *(undefined8 **)((long)i + 8);
      }
      free(__ptr);
    }
    free(i);
    return;
  }
  return;
}

Assistant:

static void floor0_free_look(vorbis_look_floor *i){
  vorbis_look_floor0 *look=(vorbis_look_floor0 *)i;
  if(look){

    if(look->linearmap){

      if(look->linearmap[0])_ogg_free(look->linearmap[0]);
      if(look->linearmap[1])_ogg_free(look->linearmap[1]);

      _ogg_free(look->linearmap);
    }
    memset(look,0,sizeof(*look));
    _ogg_free(look);
  }
}